

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselection.cpp
# Opt level: O2

Result<wallet::SelectionResult> *
wallet::CoinGrinder(Result<wallet::SelectionResult> *__return_storage_ptr__,
                   vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_> *utxo_pool,
                   CAmount *selection_target,CAmount change_target,int max_selection_weight)

{
  int iVar1;
  int iVar2;
  unsigned_long uVar3;
  int iVar4;
  pointer puVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  pointer pOVar9;
  int iVar10;
  __normal_iterator<wallet::OutputGroup_*,_std::vector<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>_>
  __i;
  pointer pOVar11;
  long lVar12;
  pointer pOVar13;
  size_t sVar14;
  iterator __begin1;
  pointer puVar15;
  long in_FS_OFFSET;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  long local_248;
  anon_class_32_4_ac040c79 deselect_last;
  size_t next_utxo;
  int curr_weight;
  CAmount curr_amount;
  vector<unsigned_long,_std::allocator<unsigned_long>_> best_selection;
  vector<unsigned_long,_std::allocator<unsigned_long>_> curr_selection;
  vector<int,_std::allocator<int>_> min_tail_weight;
  vector<long,_std::allocator<long>_> lookahead;
  SelectionResult local_198;
  bilingual_str local_128;
  SelectionResult result;
  bilingual_str local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pOVar13 = (utxo_pool->
            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pOVar9 = (utxo_pool->super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pOVar13 != pOVar9) {
    uVar6 = ((long)pOVar9 - (long)pOVar13) / 0x68;
    lVar7 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__1>>
              (pOVar13,pOVar9,((uint)lVar7 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pOVar9 - (long)pOVar13 < 0x681) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__1>>
                (pOVar13,pOVar9);
    }
    else {
      pOVar11 = pOVar13 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Iter_comp_iter<wallet::__1>>
                (pOVar13,pOVar11);
      for (; pOVar11 != pOVar9; pOVar11 = pOVar11 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<wallet::OutputGroup*,std::vector<wallet::OutputGroup,std::allocator<wallet::OutputGroup>>>,__gnu_cxx::__ops::_Val_comp_iter<wallet::__1>>
                  (pOVar11);
      }
    }
  }
  std::vector<long,_std::allocator<long>_>::vector
            (&lookahead,
             ((long)(utxo_pool->
                    super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(utxo_pool->
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x68,(allocator_type *)&result);
  std::vector<int,_std::allocator<int>_>::vector
            (&min_tail_weight,
             ((long)(utxo_pool->
                    super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(utxo_pool->
                   super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x68,(allocator_type *)&result);
  pOVar13 = (utxo_pool->
            super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)._M_impl.
            super__Vector_impl_data._M_start;
  lVar7 = ((long)(utxo_pool->
                 super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                 _M_impl.super__Vector_impl_data._M_finish - (long)pOVar13) / 0x68;
  pOVar13 = pOVar13 + lVar7;
  iVar10 = 0x7fffffff;
  lVar12 = 0;
  while (bVar16 = lVar7 != 0, lVar7 = lVar7 + -1, bVar16) {
    lookahead.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar7] = lVar12;
    min_tail_weight.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[lVar7] = iVar10;
    lVar12 = lVar12 + *(long *)(((ulong)((pOVar13[-1].m_subtract_fee_outputs ^ 1) << 5) - 0x48) +
                               (long)pOVar13);
    if (pOVar13[-1].m_weight < iVar10) {
      iVar10 = pOVar13[-1].m_weight;
    }
    pOVar13 = pOVar13 + -1;
  }
  lVar7 = change_target + *selection_target;
  if (lVar12 < lVar7) {
    local_78.original._M_dataplus._M_p = (pointer)&local_78.original.field_2;
    local_78.translated._M_string_length = 0;
    local_78.translated.field_2._8_8_ = 0;
    local_78.original.field_2._M_allocated_capacity = 0;
    local_78.original.field_2._8_8_ = 0;
    local_78.original._M_string_length = 0;
    local_78.translated._M_dataplus._M_p = (pointer)&local_78.translated.field_2;
    local_78.translated.field_2._M_allocated_capacity = 0;
    std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
    _Variant_storage<0ul,bilingual_str>
              ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
               __return_storage_ptr__,&local_78);
    bilingual_str::~bilingual_str(&local_78);
  }
  else {
    deselect_last.curr_selection = &curr_selection;
    curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    best_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    best_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    best_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    deselect_last.curr_amount = &curr_amount;
    curr_amount = 0;
    deselect_last.curr_weight = &curr_weight;
    curr_weight = 0;
    next_utxo = 0;
    result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header;
    result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
    ;
    result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    result.m_algo = CG;
    result.m_use_effective = false;
    result.m_waste.super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_engaged = false;
    result.m_algo_completed = true;
    result.m_weight = 0;
    result.bump_fee_group_discount = 0;
    local_248 = 2100000000000000;
    bVar8 = false;
    bVar16 = false;
    sVar14 = 0;
    iVar10 = max_selection_weight;
    deselect_last.utxo_pool = utxo_pool;
    result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         result.m_selected_inputs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    result.m_target = *selection_target;
LAB_002227d2:
    if (!bVar16) {
      pOVar13 = (utxo_pool->
                super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                _M_impl.super__Vector_impl_data._M_start;
      curr_amount = curr_amount +
                    *(long *)((long)&pOVar13[next_utxo].m_value +
                             (ulong)((pOVar13[next_utxo].m_subtract_fee_outputs ^ 1) << 5));
      curr_weight = curr_weight + pOVar13[next_utxo].m_weight;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&curr_selection,&next_utxo);
      next_utxo = next_utxo + 1;
      uVar3 = curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish[-1];
      if (lookahead.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar3] + curr_amount < lVar7) {
        bVar17 = true;
        bVar16 = false;
      }
      else if (iVar10 < curr_weight) {
        bVar8 = (bool)(bVar8 | max_selection_weight < curr_weight);
        iVar2 = (utxo_pool->
                super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                _M_impl.super__Vector_impl_data._M_start[uVar3].m_weight;
        iVar1 = min_tail_weight.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar3];
        bVar18 = SBORROW4(iVar2,iVar1);
        iVar4 = iVar2 - iVar1;
        bVar17 = iVar2 == iVar1;
LAB_0022287d:
        bVar16 = !bVar17 && bVar18 == iVar4 < 0;
        bVar17 = bVar17 || bVar18 != iVar4 < 0;
      }
      else {
        if (curr_amount < lVar7) {
          if (best_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              best_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            iVar4 = min_tail_weight.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar3];
            pOVar13 = (utxo_pool->
                      super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>)
                      ._M_impl.super__Vector_impl_data._M_start;
            lVar12 = *(long *)((long)&pOVar13[uVar3].m_value +
                              (ulong)((pOVar13[uVar3].m_subtract_fee_outputs ^ 1) << 5));
            if ((long)iVar10 <
                ((~curr_amount + lVar7 + lVar12) / lVar12) * (long)iVar4 + (long)curr_weight) {
              bVar18 = SBORROW4(pOVar13[uVar3].m_weight,iVar4);
              iVar4 = pOVar13[uVar3].m_weight - iVar4;
              bVar17 = iVar4 == 0;
              goto LAB_0022287d;
            }
          }
          bVar16 = false;
        }
        else {
          if (iVar10 <= curr_weight) {
            bVar17 = false;
            bVar16 = true;
            if ((curr_weight != iVar10) || (local_248 <= curr_amount)) goto LAB_00222923;
          }
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                    (&best_selection,&curr_selection);
          bVar16 = true;
          local_248 = curr_amount;
          iVar10 = curr_weight;
        }
        bVar17 = false;
      }
LAB_00222923:
      if (sVar14 == 99999) {
        result.m_algo_completed = false;
        sVar14 = 100000;
        goto LAB_002229f9;
      }
      if ((bool)(next_utxo ==
                 ((long)(utxo_pool->
                        super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(utxo_pool->
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0x68 | bVar17)) {
        CoinGrinder::anon_class_32_4_ac040c79::operator()(&deselect_last);
        bVar16 = true;
      }
      sVar14 = sVar14 + 1;
      while (bVar16) {
        if (curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start ==
            curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_finish) {
          result.m_algo_completed = true;
          break;
        }
        next_utxo = curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                    ._M_impl.super__Vector_impl_data._M_finish[-1] + 1;
        CoinGrinder::anon_class_32_4_ac040c79::operator()(&deselect_last);
        pOVar13 = (utxo_pool->
                  super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pOVar9 = pOVar13 + next_utxo;
        for (; (bVar16 = *(long *)(((ulong)((pOVar9[-1].m_subtract_fee_outputs ^ 1) << 5) - 0x48) +
                                  (long)pOVar9) ==
                         *(long *)((long)&pOVar9->m_value +
                                  (ulong)((pOVar9->m_subtract_fee_outputs ^ 1) << 5)), bVar16 &&
               (next_utxo <
                ((long)(utxo_pool->
                       super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pOVar13) / 0x68 - 1U));
            next_utxo = next_utxo + 1) {
          pOVar9 = pOVar9 + 1;
        }
      }
      goto LAB_002227d2;
    }
LAB_002229f9:
    puVar5 = best_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    result.m_selections_evaluated = sVar14;
    if (best_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        best_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if (bVar8) {
        ErrorMaxWeightExceeded();
      }
      else {
        local_128.original._M_dataplus._M_p = (pointer)&local_128.original.field_2;
        local_128.translated._M_string_length = 0;
        local_128.translated.field_2._8_8_ = 0;
        local_128.original.field_2._M_allocated_capacity = 0;
        local_128.original.field_2._8_8_ = 0;
        local_128.original._M_string_length = 0;
        local_128.translated._M_dataplus._M_p = (pointer)&local_128.translated.field_2;
        local_128.translated.field_2._M_allocated_capacity = 0;
        std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
        _Variant_storage<0ul,bilingual_str>
                  ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                   __return_storage_ptr__,&local_128);
        bilingual_str::~bilingual_str(&local_128);
      }
    }
    else {
      for (puVar15 = best_selection.
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start; puVar15 != puVar5; puVar15 = puVar15 + 1) {
        SelectionResult::AddInput
                  (&result,(utxo_pool->
                           super__Vector_base<wallet::OutputGroup,_std::allocator<wallet::OutputGroup>_>
                           )._M_impl.super__Vector_impl_data._M_start + *puVar15);
      }
      SelectionResult::SelectionResult(&local_198,&result);
      std::__detail::__variant::_Variant_storage<false,bilingual_str,wallet::SelectionResult>::
      _Variant_storage<1ul,wallet::SelectionResult>
                ((_Variant_storage<false,bilingual_str,wallet::SelectionResult> *)
                 __return_storage_ptr__,&local_198);
      _GLOBAL__N_1::std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&local_198);
    }
    _GLOBAL__N_1::std::
    _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
    ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                 *)&result);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&best_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&curr_selection.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&min_tail_weight.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<long,_std::allocator<long>_>::~_Vector_base
            (&lookahead.super__Vector_base<long,_std::allocator<long>_>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

util::Result<SelectionResult> CoinGrinder(std::vector<OutputGroup>& utxo_pool, const CAmount& selection_target, CAmount change_target, int max_selection_weight)
{
    std::sort(utxo_pool.begin(), utxo_pool.end(), descending_effval_weight);
    // The sum of UTXO amounts after this UTXO index, e.g. lookahead[5] = Σ(UTXO[6+].amount)
    std::vector<CAmount> lookahead(utxo_pool.size());
    // The minimum UTXO weight among the remaining UTXOs after this UTXO index, e.g. min_tail_weight[5] = min(UTXO[6+].weight)
    std::vector<int> min_tail_weight(utxo_pool.size());

    // Calculate lookahead values, min_tail_weights, and check that there are sufficient funds
    CAmount total_available = 0;
    int min_group_weight = std::numeric_limits<int>::max();
    for (size_t i = 0; i < utxo_pool.size(); ++i) {
        size_t index = utxo_pool.size() - 1 - i; // Loop over every element in reverse order
        lookahead[index] = total_available;
        min_tail_weight[index] = min_group_weight;
        // UTXOs with non-positive effective value must have been filtered
        Assume(utxo_pool[index].GetSelectionAmount() > 0);
        total_available += utxo_pool[index].GetSelectionAmount();
        min_group_weight = std::min(min_group_weight, utxo_pool[index].m_weight);
    }

    const CAmount total_target = selection_target + change_target;
    if (total_available < total_target) {
        // Insufficient funds
        return util::Error();
    }

    // The current selection and the best input set found so far, stored as the utxo_pool indices of the UTXOs forming them
    std::vector<size_t> curr_selection;
    std::vector<size_t> best_selection;

    // The currently selected effective amount, and the effective amount of the best selection so far
    CAmount curr_amount = 0;
    CAmount best_selection_amount = MAX_MONEY;

    // The weight of the currently selected input set, and the weight of the best selection
    int curr_weight = 0;
    int best_selection_weight = max_selection_weight; // Tie is fine, because we prefer lower selection amount

    // Whether the input sets generated during this search have exceeded the maximum transaction weight at any point
    bool max_tx_weight_exceeded = false;

    // Index of the next UTXO to consider in utxo_pool
    size_t next_utxo = 0;

    /*
     * You can think of the current selection as a vector of booleans that has decided inclusion or exclusion of all
     * UTXOs before `next_utxo`. When we consider the next UTXO, we extend this hypothetical boolean vector either with
     * a true value if the UTXO is included or a false value if it is omitted. The equivalent state is stored more
     * compactly as the list of indices of the included UTXOs and the `next_utxo` index.
     *
     * We can never find a new solution by deselecting a UTXO, because we then revisit a previously evaluated
     * selection. Therefore, we only need to check whether we found a new solution _after adding_ a new UTXO.
     *
     * Each iteration of CoinGrinder starts by selecting the `next_utxo` and evaluating the current selection. We
     * use three state transitions to progress from the current selection to the next promising selection:
     *
     * - EXPLORE inclusion branch: We do not have sufficient funds, yet. Add `next_utxo` to the current selection, then
     *                             nominate the direct successor of the just selected UTXO as our `next_utxo` for the
     *                             following iteration.
     *
     *                             Example:
     *                                 Current Selection: {0, 5, 7}
     *                                 Evaluation: EXPLORE, next_utxo: 8
     *                                 Next Selection: {0, 5, 7, 8}
     *
     * - SHIFT to omission branch: Adding more UTXOs to the current selection cannot produce a solution that is better
     *                             than the current best, e.g. the current selection weight exceeds the max weight or
     *                             the current selection amount is equal to or greater than the target.
     *                             We designate our `next_utxo` the one after the tail of our current selection, then
     *                             deselect the tail of our current selection.
     *
     *                             Example:
     *                                 Current Selection: {0, 5, 7}
     *                                 Evaluation: SHIFT, next_utxo: 8, omit last selected: {0, 5}
     *                                 Next Selection: {0, 5, 8}
     *
     * - CUT entire subtree:       We have exhausted the inclusion branch for the penultimately selected UTXO, both the
     *                             inclusion and the omission branch of the current prefix are barren. E.g. we have
     *                             reached the end of the UTXO pool, so neither further EXPLORING nor SHIFTING can find
     *                             any solutions. We designate our `next_utxo` the one after our penultimate selected,
     *                             then deselect both the last and penultimate selected.
     *
     *                             Example:
     *                                 Current Selection: {0, 5, 7}
     *                                 Evaluation: CUT, next_utxo: 6, omit two last selected: {0}
     *                                 Next Selection: {0, 6}
     */
    auto deselect_last = [&]() {
        OutputGroup& utxo = utxo_pool[curr_selection.back()];
        curr_amount -= utxo.GetSelectionAmount();
        curr_weight -= utxo.m_weight;
        curr_selection.pop_back();
    };

    SelectionResult result(selection_target, SelectionAlgorithm::CG);
    bool is_done = false;
    size_t curr_try = 0;
    while (!is_done) {
        bool should_shift{false}, should_cut{false};
        // Select `next_utxo`
        OutputGroup& utxo = utxo_pool[next_utxo];
        curr_amount += utxo.GetSelectionAmount();
        curr_weight += utxo.m_weight;
        curr_selection.push_back(next_utxo);
        ++next_utxo;
        ++curr_try;

        // EVALUATE current selection: check for solutions and see whether we can CUT or SHIFT before EXPLORING further
        auto curr_tail = curr_selection.back();
        if (curr_amount + lookahead[curr_tail] < total_target) {
            // Insufficient funds with lookahead: CUT
            should_cut = true;
        } else if (curr_weight > best_selection_weight) {
            // best_selection_weight is initialized to max_selection_weight
            if (curr_weight > max_selection_weight) max_tx_weight_exceeded = true;
            // Worse weight than best solution. More UTXOs only increase weight:
            // CUT if last selected group had minimal weight, else SHIFT
            if (utxo_pool[curr_tail].m_weight <= min_tail_weight[curr_tail]) {
                should_cut = true;
            } else {
                should_shift  = true;
            }
        } else if (curr_amount >= total_target) {
            // Success, adding more weight cannot be better: SHIFT
            should_shift  = true;
            if (curr_weight < best_selection_weight || (curr_weight == best_selection_weight && curr_amount < best_selection_amount)) {
                // New lowest weight, or same weight with fewer funds tied up
                best_selection = curr_selection;
                best_selection_weight = curr_weight;
                best_selection_amount = curr_amount;
            }
        } else if (!best_selection.empty() && curr_weight + int64_t{min_tail_weight[curr_tail]} * ((total_target - curr_amount + utxo_pool[curr_tail].GetSelectionAmount() - 1) / utxo_pool[curr_tail].GetSelectionAmount()) > best_selection_weight) {
            // Compare minimal tail weight and last selected amount with the amount missing to gauge whether a better weight is still possible.
            if (utxo_pool[curr_tail].m_weight <= min_tail_weight[curr_tail]) {
                should_cut = true;
            } else {
                should_shift = true;
            }
        }

        if (curr_try >= TOTAL_TRIES) {
            // Solution is not guaranteed to be optimal if `curr_try` hit TOTAL_TRIES
            result.SetAlgoCompleted(false);
            break;
        }

        if (next_utxo == utxo_pool.size()) {
            // Last added UTXO was end of UTXO pool, nothing left to add on inclusion or omission branch: CUT
            should_cut = true;
        }

        if (should_cut) {
            // Neither adding to the current selection nor exploring the omission branch of the last selected UTXO can
            // find any solutions. Redirect to exploring the Omission branch of the penultimate selected UTXO (i.e.
            // set `next_utxo` to one after the penultimate selected, then deselect the last two selected UTXOs)
            should_cut = false;
            deselect_last();
            should_shift  = true;
        }

        while (should_shift) {
            // Set `next_utxo` to one after last selected, then deselect last selected UTXO
            if (curr_selection.empty()) {
                // Exhausted search space before running into attempt limit
                is_done = true;
                result.SetAlgoCompleted(true);
                break;
            }
            next_utxo = curr_selection.back() + 1;
            deselect_last();
            should_shift  = false;

            // After SHIFTing to an omission branch, the `next_utxo` might have the same effective value as the UTXO we
            // just omitted. Since lower weight is our tiebreaker on UTXOs with equal effective value for sorting, if it
            // ties on the effective value, it _must_ have the same weight (i.e. be a "clone" of the prior UTXO) or a
            // higher weight. If so, selecting `next_utxo` would produce an equivalent or worse selection as one we
            // previously evaluated. In that case, increment `next_utxo` until we find a UTXO with a differing amount.
            while (utxo_pool[next_utxo - 1].GetSelectionAmount() == utxo_pool[next_utxo].GetSelectionAmount()) {
                if (next_utxo >= utxo_pool.size() - 1) {
                    // Reached end of UTXO pool skipping clones: SHIFT instead
                    should_shift = true;
                    break;
                }
                // Skip clone: previous UTXO is equivalent and unselected
                ++next_utxo;
            }
        }
    }

    result.SetSelectionsEvaluated(curr_try);

    if (best_selection.empty()) {
        return max_tx_weight_exceeded ? ErrorMaxWeightExceeded() : util::Error();
    }

    for (const size_t& i : best_selection) {
        result.AddInput(utxo_pool[i]);
    }

    return result;
}